

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.hpp
# Opt level: O2

bool __thiscall
ftxui::Renderer(std::function<std::shared_ptr<ftxui::Node>(bool)>)::Impl::OnEvent(ftxui::Event_
          (void *this,Event *event)

{
  bool bVar1;
  _func_int **local_20;
  
  if (((event->type_ == Mouse) &&
      (bVar1 = Box::Contain((Box *)((long)this + 0x28),(event->field_1).mouse_.x,
                            (event->field_1).mouse_.y), bVar1)) &&
     (ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this),
     local_20 != (_func_int **)0x0)) {
    (**(code **)(*local_20 + 8))();
    ComponentBase::TakeFocus((ComponentBase *)this);
  }
  return false;
}

Assistant:

bool is_mouse() const { return type_ == Type::Mouse; }